

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::KNearestNeighborsClassifier::_InternalParse
          (KNearestNeighborsClassifier *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  NearestNeighborsIndex *msg;
  string *s;
  uint64_t value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  uint uVar2;
  char cVar3;
  uint32_t tag;
  char *local_40;
  uint local_34;
  
  local_40 = ptr;
  do {
    while( true ) {
      bVar1 = google::protobuf::internal::ParseContext::Done(ctx,&local_40);
      if (bVar1) {
        return local_40;
      }
      local_40 = google::protobuf::internal::ReadTag(local_40,&local_34,0);
      tag_00 = local_34;
      uVar2 = local_34 >> 3;
      cVar3 = (char)local_34;
      if (uVar2 != 0xd2) break;
      if (cVar3 != -0x6e) goto LAB_001d190d;
      msg = (NearestNeighborsIndex *)_internal_mutable_inversedistanceweighting(this);
LAB_001d18ed:
      local_40 = google::protobuf::internal::ParseContext::ParseMessage
                           (ctx,&msg->super_MessageLite,local_40);
LAB_001d18fd:
      if (local_40 == (char *)0x0) {
        return (char *)0x0;
      }
    }
    if (uVar2 == 3) {
      if (cVar3 != '\x1a') goto LAB_001d190d;
      msg = (NearestNeighborsIndex *)_internal_mutable_numberofneighbors(this);
      goto LAB_001d18ed;
    }
    if (uVar2 == 100) {
      if (cVar3 != '\"') goto LAB_001d190d;
      msg = (NearestNeighborsIndex *)_internal_mutable_stringclasslabels(this);
      goto LAB_001d18ed;
    }
    if (uVar2 == 0x65) {
      if (cVar3 != '*') goto LAB_001d190d;
      msg = (NearestNeighborsIndex *)_internal_mutable_int64classlabels(this);
      goto LAB_001d18ed;
    }
    if (uVar2 != 0x6e) {
      if (uVar2 == 0x6f) {
        if (cVar3 == 'x') {
          value = google::protobuf::internal::ReadVarint64(&local_40);
          _internal_set_defaultint64label(this,value);
          goto LAB_001d189e;
        }
        goto LAB_001d190d;
      }
      if (uVar2 == 200) {
        if (cVar3 != 'B') goto LAB_001d190d;
        msg = (NearestNeighborsIndex *)_internal_mutable_uniformweighting(this);
      }
      else {
        if ((uVar2 != 1) || (cVar3 != '\n')) goto LAB_001d190d;
        msg = _internal_mutable_nearestneighborsindex(this);
      }
      goto LAB_001d18ed;
    }
    if (cVar3 != 'r') {
LAB_001d190d:
      if ((local_34 == 0) || ((local_34 & 7) == 4)) {
        if (local_40 == (char *)0x0) {
          return (char *)0x0;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_34 - 1;
        return local_40;
      }
      unknown = google::protobuf::internal::InternalMetadata::
                mutable_unknown_fields<std::__cxx11::string>
                          (&(this->super_MessageLite)._internal_metadata_);
      local_40 = google::protobuf::internal::UnknownFieldParse(tag_00,unknown,local_40,ctx);
      goto LAB_001d18fd;
    }
    s = _internal_mutable_defaultstringlabel_abi_cxx11_(this);
    local_40 = google::protobuf::internal::InlineGreedyStringParser(s,local_40,ctx);
    bVar1 = google::protobuf::internal::VerifyUTF8(s,(char *)0x0);
    if (!bVar1) {
      return (char *)0x0;
    }
LAB_001d189e:
    if (local_40 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* KNearestNeighborsClassifier::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // .CoreML.Specification.NearestNeighborsIndex nearestNeighborsIndex = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr = ctx->ParseMessage(_internal_mutable_nearestneighborsindex(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.Int64Parameter numberOfNeighbors = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_numberofneighbors(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.StringVector stringClassLabels = 100;
      case 100:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 34)) {
          ptr = ctx->ParseMessage(_internal_mutable_stringclasslabels(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
      case 101:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 42)) {
          ptr = ctx->ParseMessage(_internal_mutable_int64classlabels(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string defaultStringLabel = 110;
      case 110:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 114)) {
          auto str = _internal_mutable_defaultstringlabel();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int64 defaultInt64Label = 111;
      case 111:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 120)) {
          _internal_set_defaultint64label(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.UniformWeighting uniformWeighting = 200;
      case 200:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 66)) {
          ptr = ctx->ParseMessage(_internal_mutable_uniformweighting(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.InverseDistanceWeighting inverseDistanceWeighting = 210;
      case 210:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 146)) {
          ptr = ctx->ParseMessage(_internal_mutable_inversedistanceweighting(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}